

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O0

void __thiscall wasm::LoopInvariantCodeMotion::visitLoop(LoopInvariantCodeMotion *this,Loop *loop)

{
  allocator<unsigned_int> *this_00;
  LocalSet *pLVar1;
  bool bVar2;
  bool bVar3;
  PassOptions *pPVar4;
  Module *pMVar5;
  Function *this_01;
  pointer __n;
  reference pppEVar6;
  Block *pBVar7;
  size_t sVar8;
  reference ppLVar9;
  reference pvVar10;
  Nop *pNVar11;
  pair<std::__detail::_Node_iterator<wasm::LocalSet_*,_true,_false>,_bool> pVar12;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  bool local_6c7;
  bool local_6c4;
  undefined1 local_640 [2] [12];
  undefined1 local_628 [12];
  Block *local_618;
  Block *ret;
  Builder builder;
  LocalSet *set_4;
  iterator __end7_1;
  iterator __begin7_1;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range7_1;
  LocalSet *local_5e0;
  LocalSet *set_3;
  iterator __end7;
  iterator __begin7;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range7;
  LocalSet *set_2;
  iterator __end6_1;
  iterator __begin6_1;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range6_1;
  bool canMove;
  LocalSet *set_1;
  iterator __end6;
  iterator __begin6;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range6;
  FindAll<wasm::LocalSet> currSets;
  undefined1 local_558 [3];
  bool unsafeToMove;
  EffectAnalyzer effects;
  uint local_3ec;
  Index i;
  ExpressionList *list;
  Block *block;
  Expression *curr;
  Expression **currp;
  undefined1 local_3c0 [8];
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> work;
  LocalSet *local_398;
  LocalSet *set;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__range2;
  FindAll<wasm::LocalSet> finder;
  LoopSets loopSets;
  undefined1 local_320 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> numSetsForIndex;
  size_t numLocals;
  EffectAnalyzer loopEffects;
  undefined1 local_190 [8];
  EffectAnalyzer effectsSoFar;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> movedCode;
  Loop *loop_local;
  LoopInvariantCodeMotion *this_local;
  
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pPVar4 = Pass::getPassOptions((Pass *)this);
  pMVar5 = Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
           ::getModule((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                      );
  EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_190,pPVar4,pMVar5);
  pPVar4 = Pass::getPassOptions((Pass *)this);
  pMVar5 = Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
           ::getModule((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                      );
  EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&numLocals,pPVar4,pMVar5,(Expression *)loop);
  this_01 = Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
            ::getFunction((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                           *)&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                         );
  __n = (pointer)Function::getNumLocals(this_01);
  this_00 = (allocator<unsigned_int> *)((long)&loopSets._M_h._M_single_bucket + 7);
  numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,(size_type)__n,this_00
            );
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)((long)&loopSets._M_h._M_single_bucket + 7));
  std::
  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  ::unordered_set((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                   *)&finder.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)&__range2,(Expression *)loop);
  __end2 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                     ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&__range2);
  set = (LocalSet *)
        std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                  ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)&__range2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                     *)&set), bVar2) {
    ppLVar9 = __gnu_cxx::
              __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
              ::operator*(&__end2);
    local_398 = *ppLVar9;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
                         (ulong)local_398->index);
    *pvVar10 = *pvVar10 + 1;
    pVar12 = std::
             unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
             ::insert((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                       *)&finder.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_398);
    work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)pVar12.first.super__Node_iterator_base<wasm::LocalSet_*,_false>._M_cur;
    __gnu_cxx::
    __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
    ::operator++(&__end2);
  }
  FindAll<wasm::LocalSet>::~FindAll((FindAll<wasm::LocalSet> *)&__range2);
  std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector
            ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_3c0);
  currp = &loop->body;
  std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
            ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_3c0,&currp);
  do {
    while( true ) {
      bVar2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::empty
                        ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                         local_3c0);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_01e40152;
      pppEVar6 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::back
                           ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                            local_3c0);
      curr = (Expression *)*pppEVar6;
      std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::pop_back
                ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_3c0);
      block = *(Block **)curr;
      pBVar7 = Expression::dynCast<wasm::Block>((Expression *)block);
      if (pBVar7 == (Block *)0x0) break;
      sVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(pBVar7->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      local_3ec = (uint)sVar8;
      while (local_3ec != 0) {
        local_3ec = local_3ec - 1;
        effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                     operator[](&(pBVar7->list).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ,(ulong)local_3ec);
        std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
                  ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_3c0,
                   (value_type *)
                   &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    pPVar4 = Pass::getPassOptions((Pass *)this);
    pMVar5 = Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             ::getModule((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                          *)&(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                        );
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_558,pPVar4,pMVar5,(Expression *)block);
    bVar2 = EffectAnalyzer::transfersControlFlow((EffectAnalyzer *)local_558);
    if (bVar2) {
      currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    }
    else {
      bVar2 = interestingToMove(this,(Expression *)block);
      if (bVar2) {
        bVar2 = EffectAnalyzer::writesGlobalState((EffectAnalyzer *)local_558);
        local_6c4 = true;
        if (!bVar2) {
          bVar2 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)local_190,(EffectAnalyzer *)local_558);
          local_6c4 = true;
          if (!bVar2) {
            bVar2 = EffectAnalyzer::readsMutableGlobalState((EffectAnalyzer *)local_558);
            local_6c7 = false;
            if (bVar2) {
              local_6c7 = EffectAnalyzer::writesGlobalState((EffectAnalyzer *)&numLocals);
            }
            local_6c4 = local_6c7;
          }
        }
        currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = local_6c4;
        bVar2 = EffectAnalyzer::throws((EffectAnalyzer *)local_558);
        if ((bVar2) || (bVar2 = EffectAnalyzer::throws((EffectAnalyzer *)&numLocals), bVar2)) {
          currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        }
        if (((currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) &&
           ((bVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::empty((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&effects.features), bVar2 ||
            (bVar2 = hasGetDependingOnLoopSet
                               (this,(Expression *)block,
                                (LoopSets *)
                                &finder.list.
                                 super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar2)))) {
          FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)&__range6,(Expression *)block)
          ;
          __end6 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                             ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                              &__range6);
          set_1 = (LocalSet *)
                  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                            ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                             &__range6);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                             *)&set_1), bVar2) {
            ppLVar9 = __gnu_cxx::
                      __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                      ::operator*(&__end6);
            pLVar1 = *ppLVar9;
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
                                 (ulong)pLVar1->index);
            if (*pvVar10 == 0) {
              __assert_fail("numSetsForIndex[set->index] > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LoopInvariantCodeMotion.cpp"
                            ,0x92,"void wasm::LoopInvariantCodeMotion::visitLoop(Loop *)");
            }
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
                                 (ulong)pLVar1->index);
            *pvVar10 = *pvVar10 - 1;
            __gnu_cxx::
            __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
            ::operator++(&__end6);
          }
          bVar2 = true;
          __end6_1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                               ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                                &__range6);
          set_2 = (LocalSet *)
                  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                            ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                             &__range6);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end6_1,
                                    (__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                     *)&set_2), bVar3) {
            ppLVar9 = __gnu_cxx::
                      __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                      ::operator*(&__end6_1);
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
                                 (ulong)(*ppLVar9)->index);
            if (*pvVar10 != 0) {
              bVar2 = false;
              break;
            }
            __gnu_cxx::
            __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
            ::operator++(&__end6_1);
          }
          if (bVar2) {
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count,(value_type *)&block);
            pMVar5 = Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                     ::getModule((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                                  *)&(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                                );
            Builder::Builder((Builder *)&__range7_1,pMVar5);
            pNVar11 = Builder::makeNop((Builder *)&__range7_1);
            *(Nop **)curr = pNVar11;
            __end7_1 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                                 ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                                  &__range6);
            set_4 = (LocalSet *)
                    std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                              ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                               &__range6);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end7_1,
                                      (__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                       *)&set_4), bVar2) {
              ppLVar9 = __gnu_cxx::
                        __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                        ::operator*(&__end7_1);
              builder.wasm = (Module *)*ppLVar9;
              std::
              unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
              ::erase((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                       *)&finder.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)&builder);
              __gnu_cxx::
              __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
              ::operator++(&__end7_1);
            }
            currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
          }
          else {
            __end7 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::begin
                               ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                                &__range6);
            set_3 = (LocalSet *)
                    std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::end
                              ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)
                               &__range6);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                                               *)&set_3), bVar2) {
              ppLVar9 = __gnu_cxx::
                        __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
                        ::operator*(&__end7);
              local_5e0 = *ppLVar9;
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320,
                                   (ulong)local_5e0->index);
              *pvVar10 = *pvVar10 + 1;
              __gnu_cxx::
              __normal_iterator<wasm::LocalSet_**,_std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>
              ::operator++(&__end7);
            }
            currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          FindAll<wasm::LocalSet>::~FindAll((FindAll<wasm::LocalSet> *)&__range6);
          if (currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_01e4010b;
        }
      }
      EffectAnalyzer::mergeIn((EffectAnalyzer *)local_190,(EffectAnalyzer *)local_558);
      currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
LAB_01e4010b:
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_558);
  } while ((currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) ||
          (currSets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 4));
LAB_01e40152:
  bVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::empty
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  if (!bVar2) {
    pMVar5 = Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             ::getModule((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                          *)&(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                        );
    Builder::Builder((Builder *)&ret,pMVar5);
    std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_628);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_628._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_628[8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_628._9_3_;
    local_618 = Builder::
                makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                          ((Builder *)&ret,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,type);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_618->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)loop);
    pBVar7 = local_618;
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)local_640,
               &(loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_640[0]._0_8_;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_640[0][8];
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_640[0]._9_3_;
    Block::finalize(pBVar7,type_,Unknown);
    ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                     ,(Expression *)local_618);
  }
  std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~vector
            ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)local_3c0);
  std::
  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  ::~unordered_set((unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                    *)&finder.list.
                       super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_320);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&numLocals);
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_190);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void visitLoop(Loop* loop) {
    // We accumulate all the code we can move out, and will place it
    // in a block just preceding the loop.
    std::vector<Expression*> movedCode;
    // Accumulate effects of things we can't move out - things
    // we move out later must cross them, so we must verify it
    // is ok to do so.
    EffectAnalyzer effectsSoFar(getPassOptions(), *getModule());
    // The loop's total effects also matter. For example, a store
    // in the loop means we can't move a load outside.
    // FIXME: we look at the loop "tail" area too, after the last
    //        possible branch back, which can cause false positives
    //        for bad effect interactions.
    EffectAnalyzer loopEffects(getPassOptions(), *getModule(), loop);
    // Note all the sets in each loop, and how many per index. Currently
    // EffectAnalyzer can't do that, and we need it to know if we
    // can move a set out of the loop (if there is another set
    // still there, we can't). Another possible option here is for
    // LocalGraph to track interfering sets. TODO
    // FIXME: also the loop tail issue from above.
    auto numLocals = getFunction()->getNumLocals();
    std::vector<Index> numSetsForIndex(numLocals);
    LoopSets loopSets;
    {
      FindAll<LocalSet> finder(loop);
      for (auto* set : finder.list) {
        numSetsForIndex[set->index]++;
        loopSets.insert(set);
      }
    }
    // Walk along the loop entrance, while all the code there
    // is executed unconditionally. That is the code we want to
    // move out - anything that might or might not be executed
    // may be best left alone anyhow.
    std::vector<Expression**> work;
    work.push_back(&loop->body);
    while (!work.empty()) {
      auto** currp = work.back();
      work.pop_back();
      auto* curr = *currp;
      // Look into blocks.
      if (auto* block = curr->dynCast<Block>()) {
        auto& list = block->list;
        Index i = list.size();
        while (i > 0) {
          i--;
          work.push_back(&list[i]);
        }
        continue;
        // Note that if the block had a merge at the end, we would have seen
        // a branch to it anyhow, so we would stop before that point anyhow.
      }
      // If this may branch, we are done.
      EffectAnalyzer effects(getPassOptions(), *getModule(), curr);
      if (effects.transfersControlFlow()) {
        break;
      }
      if (interestingToMove(curr)) {
        // Let's see if we can move this out.
        // Global state changes would prevent this - we might end up
        // executing them just once.
        // And we must also move across anything not moved out already,
        // so check for issues there too.
        // The rest of the loop's effects matter too, we must also
        // take into account global state like interacting loads and
        // stores.
        bool unsafeToMove = effects.writesGlobalState() ||
                            effectsSoFar.invalidates(effects) ||
                            (effects.readsMutableGlobalState() &&
                             loopEffects.writesGlobalState());
        // TODO: look into optimizing this with exceptions. for now, disallow
        if (effects.throws() || loopEffects.throws()) {
          unsafeToMove = true;
        }
        if (!unsafeToMove) {
          // So far so good. Check if our local dependencies are all
          // outside of the loop, in which case everything is good -
          // either they are before the loop and constant for us, or
          // they are after and don't matter.
          if (effects.localsRead.empty() ||
              !hasGetDependingOnLoopSet(curr, loopSets)) {
            // We have checked if our gets are influenced by sets in the loop,
            // and must also check if our sets interfere with them. To do so,
            // assume temporarily that we are moving curr out; see if any sets
            // remain for its indexes.
            FindAll<LocalSet> currSets(curr);
            for (auto* set : currSets.list) {
              assert(numSetsForIndex[set->index] > 0);
              numSetsForIndex[set->index]--;
            }
            bool canMove = true;
            for (auto* set : currSets.list) {
              if (numSetsForIndex[set->index] > 0) {
                canMove = false;
                break;
              }
            }
            if (!canMove) {
              // We failed to move the code, undo those changes.
              for (auto* set : currSets.list) {
                numSetsForIndex[set->index]++;
              }
            } else {
              // We can move it! Leave the changes, move the code, and update
              // loopSets.
              movedCode.push_back(curr);
              *currp = Builder(*getModule()).makeNop();
              for (auto* set : currSets.list) {
                loopSets.erase(set);
              }
              continue;
            }
          }
        }
      }
      // We did not move this item. Accumulate its effects.
      effectsSoFar.mergeIn(effects);
    }
    // If we moved the code out, finish up by emitting it
    // outside of the loop.
    // Note that this works with nested loops - after moving outside
    // of an inner loop, we can encounter it again in an outer loop,
    // and move it further outside, without requiring any extra pass.
    if (!movedCode.empty()) {
      // Finish the moving by emitting the code outside.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(movedCode);
      ret->list.push_back(loop);
      ret->finalize(loop->type);
      replaceCurrent(ret);
      // Note that we do not need to modify the localGraph - we keep
      // each get in a position to be influenced by exactly the same
      // sets as before.
    }
  }